

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_one_step_wearing_best(int skip)

{
  borg_best *pbVar1;
  uint8_t uVar2;
  angband_constants *paVar3;
  borg_best *pbVar4;
  int iVar5;
  _Bool _Var6;
  uint16_t uVar7;
  int n;
  int16_t *piVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  keycode_t k;
  char *what;
  
  if (borg.goal.best_item == (borg_best *)0x0) {
    return false;
  }
  do {
    paVar3 = z_info;
    iVar5 = 0;
    do {
      while( true ) {
        n = iVar5;
        pbVar1 = borg.goal.best_item + n;
        uVar2 = pbVar1->tval;
        if (((uVar2 != '\0') || (pbVar1->pval != 0)) || (pbVar1->sval != '\0')) break;
        iVar5 = n + 1;
        if ((int)(uint)z_info->equip_slots_max <= n + 1) {
          mem_free(borg.goal.best_item);
          borg.goal.do_best = skip != 0;
          borg.goal.best_item = (borg_best *)0x0;
          return false;
        }
      }
      iVar5 = n + 1;
    } while (skip != 0);
    uVar7 = borg_best_stuff_order(n);
    if (pbVar1->home == true) {
      if (borg_items[uVar7].iqty == '\0') {
        _Var6 = borg_inventory_full();
        if (!_Var6) {
          if ((ulong)z_info->store_inven_max != 0) {
            puVar11 = &(borg_shops[7].ware)->iqty;
            uVar9 = 0;
            do {
              if (((*(short *)(puVar11 + -2) == borg.goal.best_item[n].pval) &&
                  (puVar11[-4] == borg.goal.best_item[n].tval)) &&
                 (puVar11[-3] == borg.goal.best_item[n].sval)) {
                borg_keypress((int)SHOP_MENU_ITEMS[uVar9]);
                borg_keypress(0x70);
                if (1 < *puVar11) {
                  borg_keypress(0x9c);
                }
                borg.goal.best_item[n].home = false;
                return true;
              }
              uVar9 = uVar9 + 1;
              puVar11 = puVar11 + 0x388;
            } while (z_info->store_inven_max != uVar9);
          }
          what = "unable to find item in home";
          goto LAB_0022eefd;
        }
      }
      else {
        _Var6 = borg_home_full();
        if (!_Var6) {
          borg_keypress(100);
          k = 0x2f;
LAB_0022ee66:
          borg_keypress(k);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             [(ulong)uVar7 - (ulong)z_info->pack_size]);
          return true;
        }
      }
    }
    else {
      if (borg_items[uVar7].iqty == '\0') {
        piVar8 = &borg_items->pval;
        lVar10 = 0;
        do {
          if (((*piVar8 == pbVar1->pval) && (*(uint8_t *)(piVar8 + -1) == uVar2)) &&
             (*(uint8_t *)((long)piVar8 + -1) == pbVar1->sval)) {
            borg_keypress(0x77);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar10]);
            pbVar4 = borg.goal.best_item;
            pbVar1 = borg.goal.best_item + n;
            pbVar1->home = false;
            pbVar1->tval = '\0';
            pbVar4[n].pval = 0;
            pbVar4[n].sval = '\0';
            return true;
          }
          lVar10 = lVar10 + 1;
          piVar8 = piVar8 + 0x1c4;
        } while ((ulong)paVar3->pack_size + 0xc != lVar10);
        what = "unable to find item in inventory";
LAB_0022eefd:
        borg_oops(what);
        return false;
      }
      _Var6 = borg_inventory_full();
      if (!_Var6) {
        k = 0x74;
        goto LAB_0022ee66;
      }
    }
    skip = 1;
    if (borg.goal.best_item == (borg_best *)0x0) {
      return false;
    }
  } while( true );
}

Assistant:

static bool borg_one_step_wearing_best(int skip)
{
    borg_item *item;
    int        item_num = 0;
    int        slot;
    int        i;

    if (!borg.goal.best_item)
        return false;

    /* find a change */
    while (true) {
        /* skip some if there are issues with full inventory */
        int skipping = skip;
        if (borg.goal.best_item[item_num].tval
            || borg.goal.best_item[item_num].pval
            || borg.goal.best_item[item_num].sval) {
            if (skipping) {
                item_num++;
                skipping--;
                continue;
            }

            break;
        }

        item_num++;
        if (item_num >= z_info->equip_slots_max) {
            borg_clear_best();

            /* If we aren't skipping we have done our best optimization.  */
            /* if we are skipping and got to the end, we probably need */
            /*  to start over */
            if (!skip) {
                borg.goal.do_best = false;
            }

            return false;
        }
    }

    /* Extract the slot */
    slot = borg_best_stuff_order(item_num);

    /* if the item is a home item to be worn, */
    /*  * drop any item you already have in the slot */
    /*  * if the slot is empty, pick up the item and mark */
    /*    as not in the home */
    /* if the item is not a home item to be worn, */
    /*      it is an inventory item.  */
    /*  * take off any item you already have in the slot */
    /*  * if the slot is empty, wear the item */
    /* NOTE that items need to be found again because they could have */
    /*   moved slots since other objects are being taken off and dropped */
    /*   into inventory and the home*/
    if (borg.goal.best_item[item_num].home) {
        /* if wearing an item in that slot, drop it */
        if (borg_items[slot].iqty) {

            /* if we can't drop an item into the home try the next change */
            if (borg_home_full())
                return borg_one_step_wearing_best(skip+1);


            borg_keypress('d');
            borg_keypress('/');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }

        /* if we can't get an item from the home, try the next change */
        if (borg_inventory_full())
            return borg_one_step_wearing_best(skip + 1);

        for (i = 0; i < z_info->store_inven_max; i++) {
            item = &borg_shops[BORG_HOME].ware[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;

            /* "Buy" the desired item from the home */
            borg_keypress(SHOP_MENU_ITEMS[i]);
            borg_keypress('p');
            if (item->iqty > 1)
                borg_keypress(KC_ENTER);


            borg.goal.best_item[item_num].home = false;
            return true;
        }
        borg_oops("unable to find item in home");
    } else {
        /* if wearing an item in that slot, take it off */
        if (borg_items[slot].iqty) {
            /* take off an item because there is no room, try next */
            if (borg_inventory_full())
                return borg_one_step_wearing_best(skip + 1);

            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }
        for (i = 0; i < INVEN_TOTAL; i++) {
            item = &borg_items[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);

            borg.goal.best_item[item_num].home = false;
            borg.goal.best_item[item_num].tval = 0;
            borg.goal.best_item[item_num].pval = 0;
            borg.goal.best_item[item_num].sval = 0;
            return true;
        }
        borg_oops("unable to find item in inventory");
    }

    return false;
}